

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

int __thiscall mpt::layout::text::convert(text *this,type_t type,void *ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = type_properties<mpt::layout::text_*>::id(true);
  iVar3 = (int)type;
  if (iVar1 < 0) {
    iVar1 = 0x100;
LAB_00135aa6:
    if (type == 0) {
      if (ptr == (void *)0x0) {
        return iVar1;
      }
      *(uint8_t **)ptr = convert::fmt;
      return iVar1;
    }
  }
  else {
    if (iVar3 < 1) goto LAB_00135aa6;
    iVar2 = type_properties<mpt::layout::text_*>::id(true);
    if (iVar2 == iVar3) {
      if (ptr == (void *)0x0) {
        return iVar1;
      }
      goto LAB_00135a96;
    }
  }
  if (ptr == (void *)0x0 || iVar3 != 0x100) {
    if (iVar3 == 0x100) goto LAB_00135ae1;
    if (iVar3 != 0x84 || ptr == (void *)0x0) {
      if (iVar3 != 0x84) {
        if (iVar3 < 1) {
          return -3;
        }
        iVar2 = type_properties<mpt::text_*>::id(true);
        if (iVar2 != iVar3) {
          iVar2 = type_properties<mpt::color>::id(true);
          if (iVar2 != iVar3) {
            return -3;
          }
          if (ptr == (void *)0x0) {
            return iVar1;
          }
          *(color *)ptr = (this->super_text).color;
          return iVar1;
        }
        iVar1 = 0x84;
        if (ptr == (void *)0x0) {
          return 0x84;
        }
        this = (text *)&this->super_text;
LAB_00135a96:
        *(text **)ptr = this;
        return iVar1;
      }
      goto LAB_00135ae1;
    }
    this = (text *)&this->super_object;
  }
  *(text **)ptr = this;
LAB_00135ae1:
  iVar3 = type_properties<mpt::text_*>::id(true);
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int layout::text::convert(type_t type, void *ptr)
{
	int me = type_properties<text *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast< ::mpt::text *>(this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(color, type, ptr)) {
		return me;
	}
	return MPT_ERROR(BadType);
}